

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc-threshold.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  ushort **ppuVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  undefined8 *in_RSI;
  undefined8 *puVar6;
  int in_EDI;
  undefined8 *puVar7;
  byte bVar8;
  double dVar9;
  double cur_thresh;
  double ok_thresh;
  size_t rfail;
  size_t nfail;
  char *fname;
  double r;
  int irad;
  double min_threshold;
  double nrad;
  double rmin;
  double rmax;
  double nmin;
  double h;
  double threshold;
  int testcase;
  int nspin;
  int id;
  xc_values_type values;
  int in_stack_ffffffffffffceec;
  char *in_stack_ffffffffffffcef0;
  int in_stack_ffffffffffffd094;
  double in_stack_ffffffffffffd128;
  testcase_t in_stack_ffffffffffffd134;
  int *in_stack_ffffffffffffd138;
  xc_values_type *in_stack_ffffffffffffd140;
  double in_stack_ffffffffffffd738;
  int in_stack_ffffffffffffd740;
  int in_stack_ffffffffffffd744;
  undefined1 auVar27 [128];
  undefined1 in_stack_ffffffffffffd780 [6208];
  undefined1 auVar10 [6208];
  undefined1 auVar11 [6208];
  undefined1 auVar12 [6208];
  undefined1 auVar13 [6208];
  undefined1 auVar14 [6208];
  undefined1 auVar15 [6208];
  undefined1 auVar16 [6208];
  undefined1 auVar17 [6208];
  undefined1 auVar18 [6208];
  undefined1 auVar19 [6208];
  undefined1 auVar20 [6208];
  undefined1 auVar21 [6208];
  undefined1 auVar22 [6208];
  undefined1 auVar23 [6208];
  xc_values_type values_00;
  undefined1 auVar24 [6208];
  undefined1 auVar25 [6208];
  undefined1 auVar26 [6208];
  int local_4;
  
  bVar8 = 0;
  auVar10._4120_2088_ = in_stack_ffffffffffffd780._4120_2088_;
  auVar10._0_4112_ = in_stack_ffffffffffffd780._0_4112_;
  auVar10._4112_8_ = 0x3f9999999999999a;
  auVar11._4112_2096_ = auVar10._4112_2096_;
  auVar11._0_4104_ = in_stack_ffffffffffffd780._0_4104_;
  auVar11._4104_8_ = 0x3379b604aaaca626;
  dVar9 = log(1e-60);
  auVar12._4104_2104_ = auVar11._4104_2104_;
  auVar12._0_4096_ = auVar11._0_4096_;
  auVar12._4096_8_ = -dVar9 / 2.0;
  auVar13._4096_2112_ = auVar12._4096_2112_;
  auVar13._0_4088_ = auVar11._0_4088_;
  auVar13._4088_8_ = 0x3e112e0be826d695;
  dVar9 = log((-dVar9 / 2.0) / 1e-09);
  dVar9 = ceil(dVar9 / 0.025);
  auVar14._4088_2120_ = auVar13._4088_2120_;
  auVar14._0_4080_ = auVar13._0_4080_;
  auVar14._4080_8_ = dVar9;
  auVar15._4080_2128_ = auVar14._4080_2128_;
  auVar15._0_4072_ = auVar13._0_4072_;
  auVar15._4072_8_ = 0x37a16c262777579c;
  if (in_EDI == 2) {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*(char *)in_RSI[1]] & 0x400) == 0) {
      iVar1 = atoi((char *)in_RSI[1]);
      auVar16._4144_2064_ = auVar15._4144_2064_;
      auVar16._0_4140_ = auVar15._0_4140_;
      auVar16._4140_4_ = iVar1;
    }
    else {
      iVar1 = xc_functional_get_number(in_stack_ffffffffffffcef0);
      auVar16._4144_2064_ = auVar15._4144_2064_;
      auVar16._0_4140_ = auVar15._0_4140_;
      auVar16._4140_4_ = iVar1;
    }
    pcVar3 = xc_functional_get_name(in_stack_ffffffffffffceec);
    auVar17._4056_2152_ = auVar16._4056_2152_;
    auVar17._0_4048_ = auVar16._0_4048_;
    auVar17._4048_8_ = pcVar3;
    printf("Functional id %i : %s\n",(ulong)auVar16._4140_4_,pcVar3);
    auVar18._4128_2080_ = auVar17._4128_2080_;
    auVar18._0_4120_ = auVar17._0_4120_;
    auVar18._4120_8_ = 0x3ff0000000000000;
    while( true ) {
      auVar19._4048_2160_ = auVar18._4048_2160_;
      auVar19._0_4040_ = auVar18._0_4040_;
      auVar19._4040_8_ = 0;
      auVar20._4136_2072_ = auVar18._4136_2072_;
      auVar20._0_4132_ = auVar19._0_4132_;
      auVar20._4132_4_ = 0;
      while (auVar20._4132_4_ < 6) {
        auVar21._4072_2136_ = auVar20._4072_2136_;
        auVar21._0_4068_ = auVar20._0_4068_;
        auVar21._4068_4_ = 0;
        while ((double)auVar21._4068_4_ < auVar21._4080_8_) {
          dVar9 = exp((double)auVar21._4068_4_ * 0.025);
          auVar22._4064_2144_ = auVar21._4064_2144_;
          auVar22._0_4056_ = auVar21._0_4056_;
          auVar22._4056_8_ = dVar9 * 1e-09;
          compute_input(in_stack_ffffffffffffd140,in_stack_ffffffffffffd138,
                        in_stack_ffffffffffffd134,in_stack_ffffffffffffd128);
          auVar23._4016_2192_ = auVar22._4016_2192_;
          auVar23._0_4012_ = auVar22._0_4012_;
          auVar23._4012_4_ = auVar22._4140_4_;
          values_00._4012_2196_ = auVar23._4012_2196_;
          values_00._0_4008_ = auVar22._0_4008_;
          values_00.v4rhosigma2tau[0x18]._0_4_ = auVar22._4136_4_;
          puVar6 = (undefined8 *)&stack0xffffffffffffe7b0;
          puVar7 = (undefined8 *)&stack0xffffffffffffcee8;
          for (lVar5 = 0x308; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar7 = *puVar6;
            puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          sVar4 = check_xc(in_stack_ffffffffffffd744,in_stack_ffffffffffffd740,values_00,
                           in_stack_ffffffffffffd738);
          auVar24._0_4032_ = values_00._0_4032_;
          auVar24._4032_8_ = sVar4;
          auVar24._4048_2160_ = values_00._4048_2160_;
          auVar24._4040_8_ = sVar4 + (long)values_00.v4rhosigma2tau[0x1c];
          auVar21._4072_2136_ = values_00._4072_2136_;
          auVar21._0_4068_ = auVar24._0_4068_;
          auVar21._4068_4_ = values_00.v4rhosigma2tau[0x1f]._4_4_ + 1;
        }
        auVar20._4136_2072_ = auVar21._4136_2072_;
        auVar20._0_4132_ = auVar21._0_4132_;
        auVar20._4132_4_ = auVar21._4132_4_ + 1;
      }
      dVar9 = auVar20._4120_8_;
      if ((auVar20._4040_8_ != 0) || (dVar9 <= 1e-40)) break;
      auVar18._4128_2080_ = auVar20._4128_2080_;
      auVar18._0_4120_ = auVar20._0_4120_;
      auVar18._4120_8_ = dVar9 / 10.0;
    }
    if (dVar9 <= 1e-40) {
      printf("Search capped by set minimum threshold %e.\n",0x37a16c262777579c);
    }
    auVar25._4032_2176_ = auVar20._4032_2176_;
    auVar25._0_4024_ = auVar20._0_4024_;
    auVar25._4024_8_ = auVar20._4120_8_ * 10.0;
    dVar9 = get_threshold(in_stack_ffffffffffffd094);
    auVar26._4024_2184_ = auVar25._4024_2184_;
    auVar26._0_4016_ = auVar25._0_4016_;
    auVar26._4016_8_ = dVar9;
    auVar27 = auVar26._4016_128_;
    printf("Current default threshold: %e\n",dVar9);
    printf("Estimated working threshold: %e\n",auVar27._8_8_);
    if (auVar27._0_8_ < auVar27._8_8_) {
      printf("WARNING: FUNCTIONAL THRESHOLD FOR %s (ID = %i) SHOULD BE INCREASED TO %e!\n",
             auVar27._8_8_,auVar27._32_8_,(ulong)auVar27._124_4_);
    }
    if (auVar27._8_8_ < auVar27._0_8_) {
      printf("FUNCTIONAL THRESHOLD FOR %s (ID = %i) COULD BE DECREASED FROM %e TO %e!\n",
             auVar27._0_8_,auVar27._8_8_,auVar27._32_8_,(ulong)auVar27._124_4_);
    }
    libxc_free((void *)0x158bfd);
    local_4 = 0;
  }
  else {
    printf("Usage:\n%s funct\n",*in_RSI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
  /* xc values */
  xc_values_type values;
  /* functional id */
  int id;
  /* spin type */
  int nspin;

  /* test case */
  int testcase;
  /* Current threshold */
  double threshold;

  /* logarithmic grid spacing */
  const double h = 0.025;
  /* density at end point */
  const double nmin = 1e-60;
  /* since we use an exponential density with zeta = 1.0, the
     necessary maximal radius is */
  const double rmax = -log(nmin) / 2;
  /* the closest point should be at */
  const double rmin = 1.0e-9;
  /* this leads to the number of radial points as */
  const double nrad = ceil(log(rmax/rmin) / h);

  /* Minimal threshold to check */
  const double min_threshold = 1e-40;

  /* radial point id */
  int irad;
  /* radius */
  double r;
  /* functional name */
  char *fname;

  /* Read in function id */
  if (argc != 2) {
    printf("Usage:\n%s funct\n", argv[0]);
    return 1;
  }

#if 0
  printf("logarithmic spacing h = %e yields %lu radial points\n", h,
         (long unsigned)nrad);
  printf("rmax = %e, nmin = %e\n", rmin*exp(h * (nrad - 1)),
         exp(-2 * rmin * exp(h * (nrad - 1))));
#endif

  /* Is functional defined by a string constant? */
  if (isalpha(argv[1][0]))
    id = xc_functional_get_number(argv[1]);
  else
    id = atoi(argv[1]);

  /* Get functional name */
  fname = xc_functional_get_name(id);
  printf("Functional id %i : %s\n", id, fname);

  /* Initial value for threshold */
  threshold = 1.0;
  while (1) {
    /* Number of failed data points */
    size_t nfail = 0;
    /* Run all test cases for the given threshold */
    for (testcase = 0; testcase < NOSUCH_TEST; testcase++) {
      /* Loop over radius */
      for (irad = 0; irad < nrad; irad++) {
        size_t rfail;
        /* Calculate radius */
        r = rmin*exp(h * irad);
        /* Compute the input data */
        compute_input(&values, &nspin, (testcase_t) testcase, r);
        /* Compute the functional */
        rfail = check_xc(id, nspin, values, threshold);
        nfail += rfail;
#ifdef XC_DEBUG
        if (rfail) {
          printf("%lu failures for %s at r = %e\n", rfail, testcases[testcase],
                 r);
        }
#endif
      }
    }

    if (nfail == 0 && threshold > min_threshold) {
      /* Values are still OK, go further */
      threshold /= 10.0;
    } else {
      if(threshold <= min_threshold) {
        printf("Search capped by set minimum threshold %e.\n", min_threshold);
      }

      /* Working threshold */
      double ok_thresh = threshold * 10.0;
      /* Current threshold */
      double cur_thresh = get_threshold(id);

#ifdef XC_DEBUG
      printf("%lu non-finite values encountered for threshold=%e\n",
             (long unsigned)nfail, threshold);
#endif

      printf("Current default threshold: %e\n", cur_thresh);
      /* We got numerical instabilities, so the threshold is the previous one */
      printf("Estimated working threshold: %e\n", ok_thresh);

      if (cur_thresh < ok_thresh) {
        printf("WARNING: FUNCTIONAL THRESHOLD FOR %s (ID = %i) SHOULD BE "
               "INCREASED TO %e!\n",
               fname, id, ok_thresh);
      }
      if (cur_thresh > ok_thresh) {
        printf("FUNCTIONAL THRESHOLD FOR %s (ID = %i) COULD BE DECREASED FROM "
               "%e TO %e!\n",
               fname, id, cur_thresh, ok_thresh);
      }

      break;
    }
  }

  libxc_free(fname);

  return 0;
}